

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LTAircraft.cpp
# Opt level: O0

bool LTAircraft::FlightModel::MatchesCar(string *_callSign)

{
  bool bVar1;
  size_type sVar2;
  smatch m;
  regex *re;
  iterator __end1;
  iterator __begin1;
  list<std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>,_std::allocator<std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>_>_>
  *__range1;
  list<std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>,_std::allocator<std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>_>_>
  *in_stack_ffffffffffffff98;
  uint in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa4;
  match_flag_type in_stack_ffffffffffffffac;
  basic_regex<char,_std::__cxx11::regex_traits<char>_> *in_stack_ffffffffffffffb0;
  match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  *in_stack_ffffffffffffffb8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffc0;
  _Self local_28;
  _Self local_20;
  list<std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>,_std::allocator<std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>_>_>
  *local_18;
  byte local_1;
  
  local_18 = &listCarRegex_abi_cxx11_;
  local_20._M_node =
       (_List_node_base *)
       std::__cxx11::
       list<std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>,_std::allocator<std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>_>_>
       ::begin(in_stack_ffffffffffffff98);
  local_28._M_node =
       (_List_node_base *)
       std::__cxx11::
       list<std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>,_std::allocator<std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>_>_>
       ::end(in_stack_ffffffffffffff98);
  while (bVar1 = std::operator!=(&local_20,&local_28), bVar1) {
    std::_List_iterator<std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>_>::
    operator*((_List_iterator<std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>_> *
              )0x191929);
    std::__cxx11::
    match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
    ::match_results((match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                     *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0));
    std::
    regex_search<std::char_traits<char>,std::allocator<char>,std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>>,char,std::__cxx11::regex_traits<char>>
              (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0,
               in_stack_ffffffffffffffac);
    sVar2 = std::__cxx11::
            match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
            ::size((match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                    *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0));
    if (sVar2 != 0) {
      local_1 = 1;
    }
    in_stack_ffffffffffffffa0 = (uint)(sVar2 != 0);
    std::__cxx11::
    match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
    ::~match_results((match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                      *)0x19199e);
    if (in_stack_ffffffffffffffa0 != 0) goto LAB_001919c0;
    std::_List_iterator<std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>_>::
    operator++(&local_20);
  }
  local_1 = 0;
LAB_001919c0:
  return (bool)(local_1 & 1);
}

Assistant:

bool LTAircraft::FlightModel::MatchesCar (const std::string& _callSign)
{
    // Walk the car regEx list and try each pattern
    for (const std::regex& re: listCarRegex) {
        std::smatch m;
        std::regex_search(_callSign, m, re);
        if (m.size() > 0)                   // matches?
            return true;
    }
    // no match found
    return false;
}